

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_dr_mp3_L3_dct3_9(float *y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar4 = y[2];
  fVar14 = y[4];
  fVar1 = y[8];
  fVar3 = y[1];
  fVar8 = y[5];
  fVar2 = y[7];
  fVar11 = y[3] * 0.8660254;
  fVar6 = (fVar8 - fVar2) * 0.34202015;
  fVar10 = (fVar3 + fVar2) * 0.64278764;
  fVar7 = (fVar6 + fVar11) - fVar10;
  fVar5 = *y;
  fVar15 = y[6] * 0.5 + fVar5;
  fVar9 = (fVar4 + fVar14) * 0.9396926;
  fVar16 = (fVar4 + fVar1) * 0.76604444;
  fVar13 = (fVar14 - fVar1) * 0.17364818;
  fVar2 = ((fVar3 - fVar8) - fVar2) * 0.8660254;
  fVar12 = (fVar15 - fVar9) + fVar16;
  fVar9 = (fVar9 + fVar15) - fVar13;
  fVar3 = (fVar3 + fVar8) * 0.9848077;
  fVar8 = (fVar6 - fVar11) - fVar3;
  *y = fVar9 - fVar8;
  y[2] = fVar12 - fVar7;
  fVar13 = fVar13 + (fVar15 - fVar16);
  fVar14 = fVar14 + (fVar1 - fVar4);
  fVar10 = (fVar3 - fVar11) - fVar10;
  fVar5 = fVar5 - y[6];
  fVar4 = fVar5 - fVar14 * 0.5;
  y[1] = fVar4 + fVar2;
  *(ulong *)(y + 3) = CONCAT44(fVar14 + fVar5,fVar13 + fVar10);
  y[5] = fVar13 - fVar10;
  y[6] = fVar7 + fVar12;
  y[7] = fVar4 - fVar2;
  y[8] = fVar8 + fVar9;
  return;
}

Assistant:

static void ma_dr_mp3_L3_dct3_9(float *y)
{
    float s0, s1, s2, s3, s4, s5, s6, s7, s8, t0, t2, t4;
    s0 = y[0]; s2 = y[2]; s4 = y[4]; s6 = y[6]; s8 = y[8];
    t0 = s0 + s6*0.5f;
    s0 -= s6;
    t4 = (s4 + s2)*0.93969262f;
    t2 = (s8 + s2)*0.76604444f;
    s6 = (s4 - s8)*0.17364818f;
    s4 += s8 - s2;
    s2 = s0 - s4*0.5f;
    y[4] = s4 + s0;
    s8 = t0 - t2 + s6;
    s0 = t0 - t4 + t2;
    s4 = t0 + t4 - s6;
    s1 = y[1]; s3 = y[3]; s5 = y[5]; s7 = y[7];
    s3 *= 0.86602540f;
    t0 = (s5 + s1)*0.98480775f;
    t4 = (s5 - s7)*0.34202014f;
    t2 = (s1 + s7)*0.64278761f;
    s1 = (s1 - s5 - s7)*0.86602540f;
    s5 = t0 - s3 - t2;
    s7 = t4 - s3 - t0;
    s3 = t4 + s3 - t2;
    y[0] = s4 - s7;
    y[1] = s2 + s1;
    y[2] = s0 - s3;
    y[3] = s8 + s5;
    y[5] = s8 - s5;
    y[6] = s0 + s3;
    y[7] = s2 - s1;
    y[8] = s4 + s7;
}